

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec *
cram_external_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  cram_codec *pcVar1;
  code *pcVar2;
  
  pcVar1 = (cram_codec *)malloc(0x240);
  if (pcVar1 != (cram_codec *)0x0) {
    pcVar1->codec = E_EXTERNAL;
    pcVar1->free = cram_external_encode_free;
    if (option - E_INT < 2) {
      pcVar2 = cram_external_encode_int;
    }
    else {
      if (1 < option - E_BYTE) {
        abort();
      }
      pcVar2 = cram_external_encode_char;
    }
    pcVar1->encode = pcVar2;
    pcVar1->store = cram_external_encode_store;
    (pcVar1->field_6).huffman.ncodes = (int)dat;
  }
  return pcVar1;
}

Assistant:

cram_codec *cram_external_encode_init(cram_stats *st,
				      enum cram_external_type option,
				      void *dat,
				      int version) {
    cram_codec *c;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec = E_EXTERNAL;
    c->free = cram_external_encode_free;
    if (option == E_INT || option == E_LONG)
	c->encode = cram_external_encode_int;
    else if (option == E_BYTE_ARRAY || option == E_BYTE)
	c->encode = cram_external_encode_char;
    else
	abort();
    c->store = cram_external_encode_store;

    c->e_external.content_id = (size_t)dat;

    return c;
}